

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O0

void __thiscall
ObjectTest_basic_assignment_operator_list_Test::TestBody
          (ObjectTest_basic_assignment_operator_list_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_bc8 [8];
  Message local_bc0 [8];
  list<jessilib::object,_std::allocator<jessilib::object>_> local_bb8;
  list<jessilib::object,_std::allocator<jessilib::object>_> local_b98;
  list<jessilib::object,_std::allocator<jessilib::object>_> local_b78;
  undefined1 local_b60 [8];
  AssertionResult gtest_ar_12;
  AssertHelper local_b30 [8];
  Message local_b28 [15];
  bool local_b19;
  undefined1 local_b18 [8];
  AssertionResult gtest_ar__12;
  AssertHelper local_ae8 [8];
  Message local_ae0 [8];
  list<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
  local_ad8;
  list<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
  local_ab8;
  list<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
  local_a98;
  undefined1 local_a80 [8];
  AssertionResult gtest_ar_11;
  AssertHelper local_a50 [8];
  Message local_a48 [15];
  bool local_a39;
  undefined1 local_a38 [8];
  AssertionResult gtest_ar__11;
  AssertHelper local_a08 [8];
  Message local_a00 [8];
  list<long_double,_std::allocator<long_double>_> local_9f8;
  list<long_double,_std::allocator<long_double>_> local_9d8;
  list<long_double,_std::allocator<long_double>_> local_9b8;
  undefined1 local_9a0 [8];
  AssertionResult gtest_ar_10;
  AssertHelper local_970 [8];
  Message local_968 [15];
  bool local_959;
  undefined1 local_958 [8];
  AssertionResult gtest_ar__10;
  AssertHelper local_928 [8];
  Message local_920 [8];
  list<double,_std::allocator<double>_> local_918;
  list<double,_std::allocator<double>_> local_8f8;
  list<double,_std::allocator<double>_> local_8d8;
  undefined1 local_8c0 [8];
  AssertionResult gtest_ar_9;
  AssertHelper local_890 [8];
  Message local_888 [15];
  bool local_879;
  undefined1 local_878 [8];
  AssertionResult gtest_ar__9;
  AssertHelper local_848 [8];
  Message local_840 [8];
  list<float,_std::allocator<float>_> local_838;
  list<float,_std::allocator<float>_> local_818;
  list<float,_std::allocator<float>_> local_7f8;
  undefined1 local_7e0 [8];
  AssertionResult gtest_ar_8;
  AssertHelper local_7b0 [8];
  Message local_7a8 [15];
  bool local_799;
  undefined1 local_798 [8];
  AssertionResult gtest_ar__8;
  AssertHelper local_768 [8];
  Message local_760 [8];
  list<long,_std::allocator<long>_> local_758;
  list<long,_std::allocator<long>_> local_738;
  list<long,_std::allocator<long>_> local_718;
  undefined1 local_700 [8];
  AssertionResult gtest_ar_7;
  AssertHelper local_6d0 [8];
  Message local_6c8 [15];
  bool local_6b9;
  undefined1 local_6b8 [8];
  AssertionResult gtest_ar__7;
  AssertHelper local_688 [8];
  Message local_680 [8];
  list<long_long,_std::allocator<long_long>_> local_678;
  list<long_long,_std::allocator<long_long>_> local_658;
  list<long_long,_std::allocator<long_long>_> local_638;
  undefined1 local_620 [8];
  AssertionResult gtest_ar_6;
  AssertHelper local_5f0 [8];
  Message local_5e8 [15];
  bool local_5d9;
  undefined1 local_5d8 [8];
  AssertionResult gtest_ar__6;
  AssertHelper local_5a8 [8];
  Message local_5a0 [8];
  list<long,_std::allocator<long>_> local_598;
  list<long,_std::allocator<long>_> local_578;
  list<long,_std::allocator<long>_> local_558;
  undefined1 local_540 [8];
  AssertionResult gtest_ar_5;
  AssertHelper local_510 [8];
  Message local_508 [15];
  bool local_4f9;
  undefined1 local_4f8 [8];
  AssertionResult gtest_ar__5;
  AssertHelper local_4c8 [8];
  Message local_4c0 [8];
  list<int,_std::allocator<int>_> local_4b8;
  list<int,_std::allocator<int>_> local_498;
  list<int,_std::allocator<int>_> local_478;
  undefined1 local_460 [8];
  AssertionResult gtest_ar_4;
  AssertHelper local_430 [8];
  Message local_428 [15];
  bool local_419;
  undefined1 local_418 [8];
  AssertionResult gtest_ar__4;
  AssertHelper local_3e8 [8];
  Message local_3e0 [8];
  list<short,_std::allocator<short>_> local_3d8;
  list<short,_std::allocator<short>_> local_3b8;
  list<short,_std::allocator<short>_> local_398;
  undefined1 local_380 [8];
  AssertionResult gtest_ar_3;
  AssertHelper local_350 [8];
  Message local_348 [15];
  bool local_339;
  undefined1 local_338 [8];
  AssertionResult gtest_ar__3;
  AssertHelper local_308 [8];
  Message local_300 [8];
  list<unsigned_char,_std::allocator<unsigned_char>_> local_2f8;
  list<unsigned_char,_std::allocator<unsigned_char>_> local_2d8;
  list<unsigned_char,_std::allocator<unsigned_char>_> local_2b8;
  undefined1 local_2a0 [8];
  AssertionResult gtest_ar_2;
  AssertHelper local_270 [8];
  Message local_268 [15];
  bool local_259;
  undefined1 local_258 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_228 [8];
  Message local_220 [8];
  list<signed_char,_std::allocator<signed_char>_> local_218;
  list<signed_char,_std::allocator<signed_char>_> local_1f8;
  list<signed_char,_std::allocator<signed_char>_> local_1d8;
  undefined1 local_1c0 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_190 [8];
  Message local_188 [15];
  bool local_179;
  undefined1 local_178 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_148 [8];
  Message local_140 [8];
  list<bool,_std::allocator<bool>_> local_138;
  list<bool,_std::allocator<bool>_> local_118;
  list<bool,_std::allocator<bool>_> local_f8;
  undefined1 local_e0 [8];
  AssertionResult gtest_ar;
  AssertHelper local_b0 [8];
  Message local_a8 [15];
  bool local_99;
  undefined1 local_98 [8];
  AssertionResult gtest_ar_;
  list<bool,_std::allocator<bool>_> local_78;
  undefined1 local_58 [8];
  object obj;
  ObjectTest_basic_assignment_operator_list_Test *this_local;
  
  jessilib::object::object((object *)local_58);
  local_78.super__List_base<bool,_std::allocator<bool>_>._M_impl._M_node.super__List_node_base.
  _M_next = (_List_node_base *)0x0;
  local_78.super__List_base<bool,_std::allocator<bool>_>._M_impl._M_node.super__List_node_base.
  _M_prev = (_List_node_base *)0x0;
  local_78.super__List_base<bool,_std::allocator<bool>_>._M_impl._M_node._M_size = 0;
  std::__cxx11::list<bool,_std::allocator<bool>_>::list(&local_78);
  jessilib::object::operator=<std::__cxx11::list<bool,_std::allocator<bool>_>,_nullptr>
            ((object *)local_58,&local_78);
  std::__cxx11::list<bool,_std::allocator<bool>_>::~list(&local_78);
  local_99 = jessilib::object::has<std::__cxx11::list<bool,std::allocator<bool>>>
                       ((object *)local_58);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_98,&local_99,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_98);
  if (!bVar1) {
    testing::Message::Message(local_a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar.message_,local_98,"obj .has< std::list<bool> >()",
               "false");
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar.message_);
    testing::internal::AssertHelper::AssertHelper
              (local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x2bd,pcVar2);
    testing::internal::AssertHelper::operator=(local_b0,local_a8);
    testing::internal::AssertHelper::~AssertHelper(local_b0);
    std::__cxx11::string::~string((string *)&gtest_ar.message_);
    testing::Message::~Message(local_a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_98);
  local_118.super__List_base<bool,_std::allocator<bool>_>._M_impl._M_node.super__List_node_base.
  _M_next = (_List_node_base *)0x0;
  local_118.super__List_base<bool,_std::allocator<bool>_>._M_impl._M_node.super__List_node_base.
  _M_prev = (_List_node_base *)0x0;
  local_118.super__List_base<bool,_std::allocator<bool>_>._M_impl._M_node._M_size = 0;
  std::__cxx11::list<bool,_std::allocator<bool>_>::list(&local_118);
  jessilib::object::
  get<std::__cxx11::list<bool,_std::allocator<bool>_>,_std::__cxx11::list<bool,_std::allocator<bool>_>,_nullptr>
            (&local_f8,(object *)local_58,&local_118);
  local_138.super__List_base<bool,_std::allocator<bool>_>._M_impl._M_node.super__List_node_base.
  _M_next = (_List_node_base *)0x0;
  local_138.super__List_base<bool,_std::allocator<bool>_>._M_impl._M_node.super__List_node_base.
  _M_prev = (_List_node_base *)0x0;
  local_138.super__List_base<bool,_std::allocator<bool>_>._M_impl._M_node._M_size = 0;
  std::__cxx11::list<bool,_std::allocator<bool>_>::list(&local_138);
  testing::internal::EqHelper::
  Compare<std::__cxx11::list<bool,_std::allocator<bool>_>,_std::__cxx11::list<bool,_std::allocator<bool>_>,_nullptr>
            ((EqHelper *)local_e0,"obj .get< std::list<bool> >()","std::list<bool> {}",&local_f8,
             &local_138);
  std::__cxx11::list<bool,_std::allocator<bool>_>::~list(&local_138);
  std::__cxx11::list<bool,_std::allocator<bool>_>::~list(&local_f8);
  std::__cxx11::list<bool,_std::allocator<bool>_>::~list(&local_118);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e0);
  if (!bVar1) {
    testing::Message::Message(local_140);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_e0);
    testing::internal::AssertHelper::AssertHelper
              (local_148,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x2bd,pcVar2);
    testing::internal::AssertHelper::operator=(local_148,local_140);
    testing::internal::AssertHelper::~AssertHelper(local_148);
    testing::Message::~Message(local_140);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e0);
  gtest_ar__1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  std::__cxx11::list<signed_char,_std::allocator<signed_char>_>::list
            ((list<signed_char,_std::allocator<signed_char>_> *)&gtest_ar__1.message_);
  jessilib::object::
  operator=<std::__cxx11::list<signed_char,_std::allocator<signed_char>_>,_nullptr>
            ((object *)local_58,
             (list<signed_char,_std::allocator<signed_char>_> *)&gtest_ar__1.message_);
  std::__cxx11::list<signed_char,_std::allocator<signed_char>_>::~list
            ((list<signed_char,_std::allocator<signed_char>_> *)&gtest_ar__1.message_);
  local_179 = jessilib::object::has<std::__cxx11::list<signed_char,std::allocator<signed_char>>>
                        ((object *)local_58);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_178,&local_179,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_178);
  if (!bVar1) {
    testing::Message::Message(local_188);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar_1.message_,local_178,
               "obj .has< std::list<signed char> >()","false");
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar_1.message_);
    testing::internal::AssertHelper::AssertHelper
              (local_190,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x2be,pcVar2);
    testing::internal::AssertHelper::operator=(local_190,local_188);
    testing::internal::AssertHelper::~AssertHelper(local_190);
    std::__cxx11::string::~string((string *)&gtest_ar_1.message_);
    testing::Message::~Message(local_188);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_178);
  local_1f8.super__List_base<signed_char,_std::allocator<signed_char>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)0x0;
  local_1f8.super__List_base<signed_char,_std::allocator<signed_char>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)0x0;
  local_1f8.super__List_base<signed_char,_std::allocator<signed_char>_>._M_impl._M_node._M_size = 0;
  std::__cxx11::list<signed_char,_std::allocator<signed_char>_>::list(&local_1f8);
  jessilib::object::
  get<std::__cxx11::list<signed_char,_std::allocator<signed_char>_>,_std::__cxx11::list<signed_char,_std::allocator<signed_char>_>,_nullptr>
            (&local_1d8,(object *)local_58,&local_1f8);
  local_218.super__List_base<signed_char,_std::allocator<signed_char>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)0x0;
  local_218.super__List_base<signed_char,_std::allocator<signed_char>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)0x0;
  local_218.super__List_base<signed_char,_std::allocator<signed_char>_>._M_impl._M_node._M_size = 0;
  std::__cxx11::list<signed_char,_std::allocator<signed_char>_>::list(&local_218);
  testing::internal::EqHelper::
  Compare<std::__cxx11::list<signed_char,_std::allocator<signed_char>_>,_std::__cxx11::list<signed_char,_std::allocator<signed_char>_>,_nullptr>
            ((EqHelper *)local_1c0,"obj .get< std::list<signed char> >()",
             "std::list<signed char> {}",&local_1d8,&local_218);
  std::__cxx11::list<signed_char,_std::allocator<signed_char>_>::~list(&local_218);
  std::__cxx11::list<signed_char,_std::allocator<signed_char>_>::~list(&local_1d8);
  std::__cxx11::list<signed_char,_std::allocator<signed_char>_>::~list(&local_1f8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1c0);
  if (!bVar1) {
    testing::Message::Message(local_220);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1c0);
    testing::internal::AssertHelper::AssertHelper
              (local_228,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x2be,pcVar2);
    testing::internal::AssertHelper::operator=(local_228,local_220);
    testing::internal::AssertHelper::~AssertHelper(local_228);
    testing::Message::~Message(local_220);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1c0);
  gtest_ar__2.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  std::__cxx11::list<unsigned_char,_std::allocator<unsigned_char>_>::list
            ((list<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar__2.message_);
  jessilib::object::
  operator=<std::__cxx11::list<unsigned_char,_std::allocator<unsigned_char>_>,_nullptr>
            ((object *)local_58,
             (list<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar__2.message_);
  std::__cxx11::list<unsigned_char,_std::allocator<unsigned_char>_>::~list
            ((list<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar__2.message_);
  local_259 = jessilib::object::has<std::__cxx11::list<unsigned_char,std::allocator<unsigned_char>>>
                        ((object *)local_58);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_258,&local_259,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_258);
  if (!bVar1) {
    testing::Message::Message(local_268);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar_2.message_,local_258,
               "obj .has< std::list<unsigned char> >()","false");
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar_2.message_);
    testing::internal::AssertHelper::AssertHelper
              (local_270,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x2bf,pcVar2);
    testing::internal::AssertHelper::operator=(local_270,local_268);
    testing::internal::AssertHelper::~AssertHelper(local_270);
    std::__cxx11::string::~string((string *)&gtest_ar_2.message_);
    testing::Message::~Message(local_268);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_258);
  local_2d8.super__List_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)0x0;
  local_2d8.super__List_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)0x0;
  local_2d8.super__List_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl._M_node._M_size
       = 0;
  std::__cxx11::list<unsigned_char,_std::allocator<unsigned_char>_>::list(&local_2d8);
  jessilib::object::
  get<std::__cxx11::list<unsigned_char,_std::allocator<unsigned_char>_>,_std::__cxx11::list<unsigned_char,_std::allocator<unsigned_char>_>,_nullptr>
            (&local_2b8,(object *)local_58,&local_2d8);
  local_2f8.super__List_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)0x0;
  local_2f8.super__List_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)0x0;
  local_2f8.super__List_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl._M_node._M_size
       = 0;
  std::__cxx11::list<unsigned_char,_std::allocator<unsigned_char>_>::list(&local_2f8);
  testing::internal::EqHelper::
  Compare<std::__cxx11::list<unsigned_char,_std::allocator<unsigned_char>_>,_std::__cxx11::list<unsigned_char,_std::allocator<unsigned_char>_>,_nullptr>
            ((EqHelper *)local_2a0,"obj .get< std::list<unsigned char> >()",
             "std::list<unsigned char> {}",&local_2b8,&local_2f8);
  std::__cxx11::list<unsigned_char,_std::allocator<unsigned_char>_>::~list(&local_2f8);
  std::__cxx11::list<unsigned_char,_std::allocator<unsigned_char>_>::~list(&local_2b8);
  std::__cxx11::list<unsigned_char,_std::allocator<unsigned_char>_>::~list(&local_2d8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2a0);
  if (!bVar1) {
    testing::Message::Message(local_300);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2a0);
    testing::internal::AssertHelper::AssertHelper
              (local_308,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x2bf,pcVar2);
    testing::internal::AssertHelper::operator=(local_308,local_300);
    testing::internal::AssertHelper::~AssertHelper(local_308);
    testing::Message::~Message(local_300);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2a0);
  gtest_ar__3.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  std::__cxx11::list<short,_std::allocator<short>_>::list
            ((list<short,_std::allocator<short>_> *)&gtest_ar__3.message_);
  jessilib::object::operator=<std::__cxx11::list<short,_std::allocator<short>_>,_nullptr>
            ((object *)local_58,(list<short,_std::allocator<short>_> *)&gtest_ar__3.message_);
  std::__cxx11::list<short,_std::allocator<short>_>::~list
            ((list<short,_std::allocator<short>_> *)&gtest_ar__3.message_);
  local_339 = jessilib::object::has<std::__cxx11::list<short,std::allocator<short>>>
                        ((object *)local_58);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_338,&local_339,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_338);
  if (!bVar1) {
    testing::Message::Message(local_348);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar_3.message_,local_338,"obj .has< std::list<short> >()",
               "false");
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar_3.message_);
    testing::internal::AssertHelper::AssertHelper
              (local_350,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x2c0,pcVar2);
    testing::internal::AssertHelper::operator=(local_350,local_348);
    testing::internal::AssertHelper::~AssertHelper(local_350);
    std::__cxx11::string::~string((string *)&gtest_ar_3.message_);
    testing::Message::~Message(local_348);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_338);
  local_3b8.super__List_base<short,_std::allocator<short>_>._M_impl._M_node.super__List_node_base.
  _M_next = (_List_node_base *)0x0;
  local_3b8.super__List_base<short,_std::allocator<short>_>._M_impl._M_node.super__List_node_base.
  _M_prev = (_List_node_base *)0x0;
  local_3b8.super__List_base<short,_std::allocator<short>_>._M_impl._M_node._M_size = 0;
  std::__cxx11::list<short,_std::allocator<short>_>::list(&local_3b8);
  jessilib::object::
  get<std::__cxx11::list<short,_std::allocator<short>_>,_std::__cxx11::list<short,_std::allocator<short>_>,_nullptr>
            (&local_398,(object *)local_58,&local_3b8);
  local_3d8.super__List_base<short,_std::allocator<short>_>._M_impl._M_node.super__List_node_base.
  _M_next = (_List_node_base *)0x0;
  local_3d8.super__List_base<short,_std::allocator<short>_>._M_impl._M_node.super__List_node_base.
  _M_prev = (_List_node_base *)0x0;
  local_3d8.super__List_base<short,_std::allocator<short>_>._M_impl._M_node._M_size = 0;
  std::__cxx11::list<short,_std::allocator<short>_>::list(&local_3d8);
  testing::internal::EqHelper::
  Compare<std::__cxx11::list<short,_std::allocator<short>_>,_std::__cxx11::list<short,_std::allocator<short>_>,_nullptr>
            ((EqHelper *)local_380,"obj .get< std::list<short> >()","std::list<short> {}",&local_398
             ,&local_3d8);
  std::__cxx11::list<short,_std::allocator<short>_>::~list(&local_3d8);
  std::__cxx11::list<short,_std::allocator<short>_>::~list(&local_398);
  std::__cxx11::list<short,_std::allocator<short>_>::~list(&local_3b8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_380);
  if (!bVar1) {
    testing::Message::Message(local_3e0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_380);
    testing::internal::AssertHelper::AssertHelper
              (local_3e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x2c0,pcVar2);
    testing::internal::AssertHelper::operator=(local_3e8,local_3e0);
    testing::internal::AssertHelper::~AssertHelper(local_3e8);
    testing::Message::~Message(local_3e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_380);
  gtest_ar__4.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  std::__cxx11::list<int,_std::allocator<int>_>::list
            ((list<int,_std::allocator<int>_> *)&gtest_ar__4.message_);
  jessilib::object::operator=<std::__cxx11::list<int,_std::allocator<int>_>,_nullptr>
            ((object *)local_58,(list<int,_std::allocator<int>_> *)&gtest_ar__4.message_);
  std::__cxx11::list<int,_std::allocator<int>_>::~list
            ((list<int,_std::allocator<int>_> *)&gtest_ar__4.message_);
  local_419 = jessilib::object::has<std::__cxx11::list<int,std::allocator<int>>>((object *)local_58)
  ;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_418,&local_419,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_418);
  if (!bVar1) {
    testing::Message::Message(local_428);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar_4.message_,local_418,"obj .has< std::list<int> >()",
               "false");
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar_4.message_);
    testing::internal::AssertHelper::AssertHelper
              (local_430,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x2c1,pcVar2);
    testing::internal::AssertHelper::operator=(local_430,local_428);
    testing::internal::AssertHelper::~AssertHelper(local_430);
    std::__cxx11::string::~string((string *)&gtest_ar_4.message_);
    testing::Message::~Message(local_428);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_418);
  local_498.super__List_base<int,_std::allocator<int>_>._M_impl._M_node.super__List_node_base.
  _M_next = (_List_node_base *)0x0;
  local_498.super__List_base<int,_std::allocator<int>_>._M_impl._M_node.super__List_node_base.
  _M_prev = (_List_node_base *)0x0;
  local_498.super__List_base<int,_std::allocator<int>_>._M_impl._M_node._M_size = 0;
  std::__cxx11::list<int,_std::allocator<int>_>::list(&local_498);
  jessilib::object::
  get<std::__cxx11::list<int,_std::allocator<int>_>,_std::__cxx11::list<int,_std::allocator<int>_>,_nullptr>
            (&local_478,(object *)local_58,&local_498);
  local_4b8.super__List_base<int,_std::allocator<int>_>._M_impl._M_node.super__List_node_base.
  _M_next = (_List_node_base *)0x0;
  local_4b8.super__List_base<int,_std::allocator<int>_>._M_impl._M_node.super__List_node_base.
  _M_prev = (_List_node_base *)0x0;
  local_4b8.super__List_base<int,_std::allocator<int>_>._M_impl._M_node._M_size = 0;
  std::__cxx11::list<int,_std::allocator<int>_>::list(&local_4b8);
  testing::internal::EqHelper::
  Compare<std::__cxx11::list<int,_std::allocator<int>_>,_std::__cxx11::list<int,_std::allocator<int>_>,_nullptr>
            ((EqHelper *)local_460,"obj .get< std::list<int> >()","std::list<int> {}",&local_478,
             &local_4b8);
  std::__cxx11::list<int,_std::allocator<int>_>::~list(&local_4b8);
  std::__cxx11::list<int,_std::allocator<int>_>::~list(&local_478);
  std::__cxx11::list<int,_std::allocator<int>_>::~list(&local_498);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_460);
  if (!bVar1) {
    testing::Message::Message(local_4c0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_460);
    testing::internal::AssertHelper::AssertHelper
              (local_4c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x2c1,pcVar2);
    testing::internal::AssertHelper::operator=(local_4c8,local_4c0);
    testing::internal::AssertHelper::~AssertHelper(local_4c8);
    testing::Message::~Message(local_4c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_460);
  gtest_ar__5.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  std::__cxx11::list<long,_std::allocator<long>_>::list
            ((list<long,_std::allocator<long>_> *)&gtest_ar__5.message_);
  jessilib::object::operator=<std::__cxx11::list<long,_std::allocator<long>_>,_nullptr>
            ((object *)local_58,(list<long,_std::allocator<long>_> *)&gtest_ar__5.message_);
  std::__cxx11::list<long,_std::allocator<long>_>::~list
            ((list<long,_std::allocator<long>_> *)&gtest_ar__5.message_);
  local_4f9 = jessilib::object::has<std::__cxx11::list<long,std::allocator<long>>>
                        ((object *)local_58);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_4f8,&local_4f9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4f8);
  if (!bVar1) {
    testing::Message::Message(local_508);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar_5.message_,local_4f8,"obj .has< std::list<long> >()",
               "false");
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar_5.message_);
    testing::internal::AssertHelper::AssertHelper
              (local_510,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x2c2,pcVar2);
    testing::internal::AssertHelper::operator=(local_510,local_508);
    testing::internal::AssertHelper::~AssertHelper(local_510);
    std::__cxx11::string::~string((string *)&gtest_ar_5.message_);
    testing::Message::~Message(local_508);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4f8);
  local_578.super__List_base<long,_std::allocator<long>_>._M_impl._M_node.super__List_node_base.
  _M_next = (_List_node_base *)0x0;
  local_578.super__List_base<long,_std::allocator<long>_>._M_impl._M_node.super__List_node_base.
  _M_prev = (_List_node_base *)0x0;
  local_578.super__List_base<long,_std::allocator<long>_>._M_impl._M_node._M_size = 0;
  std::__cxx11::list<long,_std::allocator<long>_>::list(&local_578);
  jessilib::object::
  get<std::__cxx11::list<long,_std::allocator<long>_>,_std::__cxx11::list<long,_std::allocator<long>_>,_nullptr>
            (&local_558,(object *)local_58,&local_578);
  local_598.super__List_base<long,_std::allocator<long>_>._M_impl._M_node.super__List_node_base.
  _M_next = (_List_node_base *)0x0;
  local_598.super__List_base<long,_std::allocator<long>_>._M_impl._M_node.super__List_node_base.
  _M_prev = (_List_node_base *)0x0;
  local_598.super__List_base<long,_std::allocator<long>_>._M_impl._M_node._M_size = 0;
  std::__cxx11::list<long,_std::allocator<long>_>::list(&local_598);
  testing::internal::EqHelper::
  Compare<std::__cxx11::list<long,_std::allocator<long>_>,_std::__cxx11::list<long,_std::allocator<long>_>,_nullptr>
            ((EqHelper *)local_540,"obj .get< std::list<long> >()","std::list<long> {}",&local_558,
             &local_598);
  std::__cxx11::list<long,_std::allocator<long>_>::~list(&local_598);
  std::__cxx11::list<long,_std::allocator<long>_>::~list(&local_558);
  std::__cxx11::list<long,_std::allocator<long>_>::~list(&local_578);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_540);
  if (!bVar1) {
    testing::Message::Message(local_5a0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_540);
    testing::internal::AssertHelper::AssertHelper
              (local_5a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x2c2,pcVar2);
    testing::internal::AssertHelper::operator=(local_5a8,local_5a0);
    testing::internal::AssertHelper::~AssertHelper(local_5a8);
    testing::Message::~Message(local_5a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_540);
  gtest_ar__6.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  std::__cxx11::list<long_long,_std::allocator<long_long>_>::list
            ((list<long_long,_std::allocator<long_long>_> *)&gtest_ar__6.message_);
  jessilib::object::operator=<std::__cxx11::list<long_long,_std::allocator<long_long>_>,_nullptr>
            ((object *)local_58,(list<long_long,_std::allocator<long_long>_> *)&gtest_ar__6.message_
            );
  std::__cxx11::list<long_long,_std::allocator<long_long>_>::~list
            ((list<long_long,_std::allocator<long_long>_> *)&gtest_ar__6.message_);
  local_5d9 = jessilib::object::has<std::__cxx11::list<long_long,std::allocator<long_long>>>
                        ((object *)local_58);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_5d8,&local_5d9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5d8);
  if (!bVar1) {
    testing::Message::Message(local_5e8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar_6.message_,local_5d8,
               "obj .has< std::list<long long> >()","false");
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar_6.message_);
    testing::internal::AssertHelper::AssertHelper
              (local_5f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x2c3,pcVar2);
    testing::internal::AssertHelper::operator=(local_5f0,local_5e8);
    testing::internal::AssertHelper::~AssertHelper(local_5f0);
    std::__cxx11::string::~string((string *)&gtest_ar_6.message_);
    testing::Message::~Message(local_5e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_5d8);
  local_658.super__List_base<long_long,_std::allocator<long_long>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)0x0;
  local_658.super__List_base<long_long,_std::allocator<long_long>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)0x0;
  local_658.super__List_base<long_long,_std::allocator<long_long>_>._M_impl._M_node._M_size = 0;
  std::__cxx11::list<long_long,_std::allocator<long_long>_>::list(&local_658);
  jessilib::object::
  get<std::__cxx11::list<long_long,_std::allocator<long_long>_>,_std::__cxx11::list<long_long,_std::allocator<long_long>_>,_nullptr>
            (&local_638,(object *)local_58,&local_658);
  local_678.super__List_base<long_long,_std::allocator<long_long>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)0x0;
  local_678.super__List_base<long_long,_std::allocator<long_long>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)0x0;
  local_678.super__List_base<long_long,_std::allocator<long_long>_>._M_impl._M_node._M_size = 0;
  std::__cxx11::list<long_long,_std::allocator<long_long>_>::list(&local_678);
  testing::internal::EqHelper::
  Compare<std::__cxx11::list<long_long,_std::allocator<long_long>_>,_std::__cxx11::list<long_long,_std::allocator<long_long>_>,_nullptr>
            ((EqHelper *)local_620,"obj .get< std::list<long long> >()","std::list<long long> {}",
             &local_638,&local_678);
  std::__cxx11::list<long_long,_std::allocator<long_long>_>::~list(&local_678);
  std::__cxx11::list<long_long,_std::allocator<long_long>_>::~list(&local_638);
  std::__cxx11::list<long_long,_std::allocator<long_long>_>::~list(&local_658);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_620);
  if (!bVar1) {
    testing::Message::Message(local_680);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_620);
    testing::internal::AssertHelper::AssertHelper
              (local_688,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x2c3,pcVar2);
    testing::internal::AssertHelper::operator=(local_688,local_680);
    testing::internal::AssertHelper::~AssertHelper(local_688);
    testing::Message::~Message(local_680);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_620);
  gtest_ar__7.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  std::__cxx11::list<long,_std::allocator<long>_>::list
            ((list<long,_std::allocator<long>_> *)&gtest_ar__7.message_);
  jessilib::object::operator=<std::__cxx11::list<long,_std::allocator<long>_>,_nullptr>
            ((object *)local_58,(list<long,_std::allocator<long>_> *)&gtest_ar__7.message_);
  std::__cxx11::list<long,_std::allocator<long>_>::~list
            ((list<long,_std::allocator<long>_> *)&gtest_ar__7.message_);
  local_6b9 = jessilib::object::has<std::__cxx11::list<long,std::allocator<long>>>
                        ((object *)local_58);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_6b8,&local_6b9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_6b8);
  if (!bVar1) {
    testing::Message::Message(local_6c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar_7.message_,local_6b8,"obj .has< std::list<intmax_t> >()"
               ,"false");
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar_7.message_);
    testing::internal::AssertHelper::AssertHelper
              (local_6d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x2c4,pcVar2);
    testing::internal::AssertHelper::operator=(local_6d0,local_6c8);
    testing::internal::AssertHelper::~AssertHelper(local_6d0);
    std::__cxx11::string::~string((string *)&gtest_ar_7.message_);
    testing::Message::~Message(local_6c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_6b8);
  local_738.super__List_base<long,_std::allocator<long>_>._M_impl._M_node.super__List_node_base.
  _M_next = (_List_node_base *)0x0;
  local_738.super__List_base<long,_std::allocator<long>_>._M_impl._M_node.super__List_node_base.
  _M_prev = (_List_node_base *)0x0;
  local_738.super__List_base<long,_std::allocator<long>_>._M_impl._M_node._M_size = 0;
  std::__cxx11::list<long,_std::allocator<long>_>::list(&local_738);
  jessilib::object::
  get<std::__cxx11::list<long,_std::allocator<long>_>,_std::__cxx11::list<long,_std::allocator<long>_>,_nullptr>
            (&local_718,(object *)local_58,&local_738);
  local_758.super__List_base<long,_std::allocator<long>_>._M_impl._M_node.super__List_node_base.
  _M_next = (_List_node_base *)0x0;
  local_758.super__List_base<long,_std::allocator<long>_>._M_impl._M_node.super__List_node_base.
  _M_prev = (_List_node_base *)0x0;
  local_758.super__List_base<long,_std::allocator<long>_>._M_impl._M_node._M_size = 0;
  std::__cxx11::list<long,_std::allocator<long>_>::list(&local_758);
  testing::internal::EqHelper::
  Compare<std::__cxx11::list<long,_std::allocator<long>_>,_std::__cxx11::list<long,_std::allocator<long>_>,_nullptr>
            ((EqHelper *)local_700,"obj .get< std::list<intmax_t> >()","std::list<intmax_t> {}",
             &local_718,&local_758);
  std::__cxx11::list<long,_std::allocator<long>_>::~list(&local_758);
  std::__cxx11::list<long,_std::allocator<long>_>::~list(&local_718);
  std::__cxx11::list<long,_std::allocator<long>_>::~list(&local_738);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_700);
  if (!bVar1) {
    testing::Message::Message(local_760);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_700);
    testing::internal::AssertHelper::AssertHelper
              (local_768,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x2c4,pcVar2);
    testing::internal::AssertHelper::operator=(local_768,local_760);
    testing::internal::AssertHelper::~AssertHelper(local_768);
    testing::Message::~Message(local_760);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_700);
  gtest_ar__8.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  std::__cxx11::list<float,_std::allocator<float>_>::list
            ((list<float,_std::allocator<float>_> *)&gtest_ar__8.message_);
  jessilib::object::operator=<std::__cxx11::list<float,_std::allocator<float>_>,_nullptr>
            ((object *)local_58,(list<float,_std::allocator<float>_> *)&gtest_ar__8.message_);
  std::__cxx11::list<float,_std::allocator<float>_>::~list
            ((list<float,_std::allocator<float>_> *)&gtest_ar__8.message_);
  local_799 = jessilib::object::has<std::__cxx11::list<float,std::allocator<float>>>
                        ((object *)local_58);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_798,&local_799,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_798);
  if (!bVar1) {
    testing::Message::Message(local_7a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar_8.message_,local_798,"obj .has< std::list<float> >()",
               "false");
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar_8.message_);
    testing::internal::AssertHelper::AssertHelper
              (local_7b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x2c5,pcVar2);
    testing::internal::AssertHelper::operator=(local_7b0,local_7a8);
    testing::internal::AssertHelper::~AssertHelper(local_7b0);
    std::__cxx11::string::~string((string *)&gtest_ar_8.message_);
    testing::Message::~Message(local_7a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_798);
  local_818.super__List_base<float,_std::allocator<float>_>._M_impl._M_node.super__List_node_base.
  _M_next = (_List_node_base *)0x0;
  local_818.super__List_base<float,_std::allocator<float>_>._M_impl._M_node.super__List_node_base.
  _M_prev = (_List_node_base *)0x0;
  local_818.super__List_base<float,_std::allocator<float>_>._M_impl._M_node._M_size = 0;
  std::__cxx11::list<float,_std::allocator<float>_>::list(&local_818);
  jessilib::object::
  get<std::__cxx11::list<float,_std::allocator<float>_>,_std::__cxx11::list<float,_std::allocator<float>_>,_nullptr>
            (&local_7f8,(object *)local_58,&local_818);
  local_838.super__List_base<float,_std::allocator<float>_>._M_impl._M_node.super__List_node_base.
  _M_next = (_List_node_base *)0x0;
  local_838.super__List_base<float,_std::allocator<float>_>._M_impl._M_node.super__List_node_base.
  _M_prev = (_List_node_base *)0x0;
  local_838.super__List_base<float,_std::allocator<float>_>._M_impl._M_node._M_size = 0;
  std::__cxx11::list<float,_std::allocator<float>_>::list(&local_838);
  testing::internal::EqHelper::
  Compare<std::__cxx11::list<float,_std::allocator<float>_>,_std::__cxx11::list<float,_std::allocator<float>_>,_nullptr>
            ((EqHelper *)local_7e0,"obj .get< std::list<float> >()","std::list<float> {}",&local_7f8
             ,&local_838);
  std::__cxx11::list<float,_std::allocator<float>_>::~list(&local_838);
  std::__cxx11::list<float,_std::allocator<float>_>::~list(&local_7f8);
  std::__cxx11::list<float,_std::allocator<float>_>::~list(&local_818);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_7e0);
  if (!bVar1) {
    testing::Message::Message(local_840);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_7e0);
    testing::internal::AssertHelper::AssertHelper
              (local_848,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x2c5,pcVar2);
    testing::internal::AssertHelper::operator=(local_848,local_840);
    testing::internal::AssertHelper::~AssertHelper(local_848);
    testing::Message::~Message(local_840);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_7e0);
  gtest_ar__9.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  std::__cxx11::list<double,_std::allocator<double>_>::list
            ((list<double,_std::allocator<double>_> *)&gtest_ar__9.message_);
  jessilib::object::operator=<std::__cxx11::list<double,_std::allocator<double>_>,_nullptr>
            ((object *)local_58,(list<double,_std::allocator<double>_> *)&gtest_ar__9.message_);
  std::__cxx11::list<double,_std::allocator<double>_>::~list
            ((list<double,_std::allocator<double>_> *)&gtest_ar__9.message_);
  local_879 = jessilib::object::has<std::__cxx11::list<double,std::allocator<double>>>
                        ((object *)local_58);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_878,&local_879,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_878);
  if (!bVar1) {
    testing::Message::Message(local_888);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar_9.message_,local_878,"obj .has< std::list<double> >()",
               "false");
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar_9.message_);
    testing::internal::AssertHelper::AssertHelper
              (local_890,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x2c6,pcVar2);
    testing::internal::AssertHelper::operator=(local_890,local_888);
    testing::internal::AssertHelper::~AssertHelper(local_890);
    std::__cxx11::string::~string((string *)&gtest_ar_9.message_);
    testing::Message::~Message(local_888);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_878);
  local_8f8.super__List_base<double,_std::allocator<double>_>._M_impl._M_node.super__List_node_base.
  _M_next = (_List_node_base *)0x0;
  local_8f8.super__List_base<double,_std::allocator<double>_>._M_impl._M_node.super__List_node_base.
  _M_prev = (_List_node_base *)0x0;
  local_8f8.super__List_base<double,_std::allocator<double>_>._M_impl._M_node._M_size = 0;
  std::__cxx11::list<double,_std::allocator<double>_>::list(&local_8f8);
  jessilib::object::
  get<std::__cxx11::list<double,_std::allocator<double>_>,_std::__cxx11::list<double,_std::allocator<double>_>,_nullptr>
            (&local_8d8,(object *)local_58,&local_8f8);
  local_918.super__List_base<double,_std::allocator<double>_>._M_impl._M_node.super__List_node_base.
  _M_next = (_List_node_base *)0x0;
  local_918.super__List_base<double,_std::allocator<double>_>._M_impl._M_node.super__List_node_base.
  _M_prev = (_List_node_base *)0x0;
  local_918.super__List_base<double,_std::allocator<double>_>._M_impl._M_node._M_size = 0;
  std::__cxx11::list<double,_std::allocator<double>_>::list(&local_918);
  testing::internal::EqHelper::
  Compare<std::__cxx11::list<double,_std::allocator<double>_>,_std::__cxx11::list<double,_std::allocator<double>_>,_nullptr>
            ((EqHelper *)local_8c0,"obj .get< std::list<double> >()","std::list<double> {}",
             &local_8d8,&local_918);
  std::__cxx11::list<double,_std::allocator<double>_>::~list(&local_918);
  std::__cxx11::list<double,_std::allocator<double>_>::~list(&local_8d8);
  std::__cxx11::list<double,_std::allocator<double>_>::~list(&local_8f8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_8c0);
  if (!bVar1) {
    testing::Message::Message(local_920);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_8c0);
    testing::internal::AssertHelper::AssertHelper
              (local_928,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x2c6,pcVar2);
    testing::internal::AssertHelper::operator=(local_928,local_920);
    testing::internal::AssertHelper::~AssertHelper(local_928);
    testing::Message::~Message(local_920);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_8c0);
  gtest_ar__10.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  std::__cxx11::list<long_double,_std::allocator<long_double>_>::list
            ((list<long_double,_std::allocator<long_double>_> *)&gtest_ar__10.message_);
  jessilib::object::
  operator=<std::__cxx11::list<long_double,_std::allocator<long_double>_>,_nullptr>
            ((object *)local_58,
             (list<long_double,_std::allocator<long_double>_> *)&gtest_ar__10.message_);
  std::__cxx11::list<long_double,_std::allocator<long_double>_>::~list
            ((list<long_double,_std::allocator<long_double>_> *)&gtest_ar__10.message_);
  local_959 = jessilib::object::has<std::__cxx11::list<long_double,std::allocator<long_double>>>
                        ((object *)local_58);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_958,&local_959,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_958);
  if (!bVar1) {
    testing::Message::Message(local_968);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar_10.message_,local_958,
               "obj .has< std::list<long double> >()","false");
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar_10.message_);
    testing::internal::AssertHelper::AssertHelper
              (local_970,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x2c7,pcVar2);
    testing::internal::AssertHelper::operator=(local_970,local_968);
    testing::internal::AssertHelper::~AssertHelper(local_970);
    std::__cxx11::string::~string((string *)&gtest_ar_10.message_);
    testing::Message::~Message(local_968);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_958);
  local_9d8.super__List_base<long_double,_std::allocator<long_double>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)0x0;
  local_9d8.super__List_base<long_double,_std::allocator<long_double>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)0x0;
  local_9d8.super__List_base<long_double,_std::allocator<long_double>_>._M_impl._M_node._M_size = 0;
  std::__cxx11::list<long_double,_std::allocator<long_double>_>::list(&local_9d8);
  jessilib::object::
  get<std::__cxx11::list<long_double,_std::allocator<long_double>_>,_std::__cxx11::list<long_double,_std::allocator<long_double>_>,_nullptr>
            (&local_9b8,(object *)local_58,&local_9d8);
  local_9f8.super__List_base<long_double,_std::allocator<long_double>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)0x0;
  local_9f8.super__List_base<long_double,_std::allocator<long_double>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)0x0;
  local_9f8.super__List_base<long_double,_std::allocator<long_double>_>._M_impl._M_node._M_size = 0;
  std::__cxx11::list<long_double,_std::allocator<long_double>_>::list(&local_9f8);
  testing::internal::EqHelper::
  Compare<std::__cxx11::list<long_double,_std::allocator<long_double>_>,_std::__cxx11::list<long_double,_std::allocator<long_double>_>,_nullptr>
            ((EqHelper *)local_9a0,"obj .get< std::list<long double> >()",
             "std::list<long double> {}",&local_9b8,&local_9f8);
  std::__cxx11::list<long_double,_std::allocator<long_double>_>::~list(&local_9f8);
  std::__cxx11::list<long_double,_std::allocator<long_double>_>::~list(&local_9b8);
  std::__cxx11::list<long_double,_std::allocator<long_double>_>::~list(&local_9d8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_9a0);
  if (!bVar1) {
    testing::Message::Message(local_a00);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_9a0);
    testing::internal::AssertHelper::AssertHelper
              (local_a08,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x2c7,pcVar2);
    testing::internal::AssertHelper::operator=(local_a08,local_a00);
    testing::internal::AssertHelper::~AssertHelper(local_a08);
    testing::Message::~Message(local_a00);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_9a0);
  gtest_ar__11.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  std::__cxx11::
  list<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
  ::list((list<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
          *)&gtest_ar__11.message_);
  jessilib::object::
  operator=<std::__cxx11::list<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>,_nullptr>
            ((object *)local_58,
             (list<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
              *)&gtest_ar__11.message_);
  std::__cxx11::
  list<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
  ::~list((list<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
           *)&gtest_ar__11.message_);
  local_a39 = jessilib::object::
              has<std::__cxx11::list<std::__cxx11::u8string,std::allocator<std::__cxx11::u8string>>>
                        ((object *)local_58);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_a38,&local_a39,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a38);
  if (!bVar1) {
    testing::Message::Message(local_a48);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar_11.message_,local_a38,
               "obj .has< std::list<std::u8string> >()","false");
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar_11.message_);
    testing::internal::AssertHelper::AssertHelper
              (local_a50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x2c8,pcVar2);
    testing::internal::AssertHelper::operator=(local_a50,local_a48);
    testing::internal::AssertHelper::~AssertHelper(local_a50);
    std::__cxx11::string::~string((string *)&gtest_ar_11.message_);
    testing::Message::~Message(local_a48);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a38);
  local_ab8.
  super__List_base<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)0x0;
  local_ab8.
  super__List_base<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)0x0;
  local_ab8.
  super__List_base<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
  ._M_impl._M_node._M_size = 0;
  std::__cxx11::
  list<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
  ::list(&local_ab8);
  jessilib::object::
  get<std::__cxx11::list<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>,_std::__cxx11::list<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>,_nullptr>
            (&local_a98,(object *)local_58,&local_ab8);
  local_ad8.
  super__List_base<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)0x0;
  local_ad8.
  super__List_base<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)0x0;
  local_ad8.
  super__List_base<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
  ._M_impl._M_node._M_size = 0;
  std::__cxx11::
  list<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
  ::list(&local_ad8);
  testing::internal::EqHelper::
  Compare<std::__cxx11::list<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>,_std::__cxx11::list<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>,_nullptr>
            ((EqHelper *)local_a80,"obj .get< std::list<std::u8string> >()",
             "std::list<std::u8string> {}",&local_a98,&local_ad8);
  std::__cxx11::
  list<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
  ::~list(&local_ad8);
  std::__cxx11::
  list<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
  ::~list(&local_a98);
  std::__cxx11::
  list<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
  ::~list(&local_ab8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a80);
  if (!bVar1) {
    testing::Message::Message(local_ae0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_a80);
    testing::internal::AssertHelper::AssertHelper
              (local_ae8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x2c8,pcVar2);
    testing::internal::AssertHelper::operator=(local_ae8,local_ae0);
    testing::internal::AssertHelper::~AssertHelper(local_ae8);
    testing::Message::~Message(local_ae0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a80);
  gtest_ar__12.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  std::__cxx11::list<jessilib::object,_std::allocator<jessilib::object>_>::list
            ((list<jessilib::object,_std::allocator<jessilib::object>_> *)&gtest_ar__12.message_);
  jessilib::object::
  operator=<std::__cxx11::list<jessilib::object,_std::allocator<jessilib::object>_>,_nullptr>
            ((object *)local_58,
             (list<jessilib::object,_std::allocator<jessilib::object>_> *)&gtest_ar__12.message_);
  std::__cxx11::list<jessilib::object,_std::allocator<jessilib::object>_>::~list
            ((list<jessilib::object,_std::allocator<jessilib::object>_> *)&gtest_ar__12.message_);
  local_b19 = jessilib::object::
              has<std::__cxx11::list<jessilib::object,std::allocator<jessilib::object>>>
                        ((object *)local_58);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_b18,&local_b19,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b18);
  if (!bVar1) {
    testing::Message::Message(local_b28);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar_12.message_,local_b18,"obj .has< std::list<object> >()",
               "false");
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar_12.message_);
    testing::internal::AssertHelper::AssertHelper
              (local_b30,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x2c9,pcVar2);
    testing::internal::AssertHelper::operator=(local_b30,local_b28);
    testing::internal::AssertHelper::~AssertHelper(local_b30);
    std::__cxx11::string::~string((string *)&gtest_ar_12.message_);
    testing::Message::~Message(local_b28);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b18);
  local_b98.super__List_base<jessilib::object,_std::allocator<jessilib::object>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)0x0;
  local_b98.super__List_base<jessilib::object,_std::allocator<jessilib::object>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)0x0;
  local_b98.super__List_base<jessilib::object,_std::allocator<jessilib::object>_>._M_impl._M_node.
  _M_size = 0;
  std::__cxx11::list<jessilib::object,_std::allocator<jessilib::object>_>::list(&local_b98);
  jessilib::object::
  get<std::__cxx11::list<jessilib::object,_std::allocator<jessilib::object>_>,_std::__cxx11::list<jessilib::object,_std::allocator<jessilib::object>_>,_nullptr>
            (&local_b78,(object *)local_58,&local_b98);
  local_bb8.super__List_base<jessilib::object,_std::allocator<jessilib::object>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)0x0;
  local_bb8.super__List_base<jessilib::object,_std::allocator<jessilib::object>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)0x0;
  local_bb8.super__List_base<jessilib::object,_std::allocator<jessilib::object>_>._M_impl._M_node.
  _M_size = 0;
  std::__cxx11::list<jessilib::object,_std::allocator<jessilib::object>_>::list(&local_bb8);
  testing::internal::EqHelper::
  Compare<std::__cxx11::list<jessilib::object,_std::allocator<jessilib::object>_>,_std::__cxx11::list<jessilib::object,_std::allocator<jessilib::object>_>,_nullptr>
            ((EqHelper *)local_b60,"obj .get< std::list<object> >()","std::list<object> {}",
             &local_b78,&local_bb8);
  std::__cxx11::list<jessilib::object,_std::allocator<jessilib::object>_>::~list(&local_bb8);
  std::__cxx11::list<jessilib::object,_std::allocator<jessilib::object>_>::~list(&local_b78);
  std::__cxx11::list<jessilib::object,_std::allocator<jessilib::object>_>::~list(&local_b98);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b60);
  if (!bVar1) {
    testing::Message::Message(local_bc0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_b60);
    testing::internal::AssertHelper::AssertHelper
              (local_bc8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x2c9,pcVar2);
    testing::internal::AssertHelper::operator=(local_bc8,local_bc0);
    testing::internal::AssertHelper::~AssertHelper(local_bc8);
    testing::Message::~Message(local_bc0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b60);
  jessilib::object::~object((object *)local_58);
  return;
}

Assistant:

TEST(ObjectTest, basic_assignment_operator_list) {
	object obj;

	OBJECT_BASIC_ASSIGNMENT_OPERATOR_TEST(obj, std::list<bool>);
	OBJECT_BASIC_ASSIGNMENT_OPERATOR_TEST(obj, std::list<signed char>);
	OBJECT_BASIC_ASSIGNMENT_OPERATOR_TEST(obj, std::list<unsigned char>);
	OBJECT_BASIC_ASSIGNMENT_OPERATOR_TEST(obj, std::list<short>);
	OBJECT_BASIC_ASSIGNMENT_OPERATOR_TEST(obj, std::list<int>);
	OBJECT_BASIC_ASSIGNMENT_OPERATOR_TEST(obj, std::list<long>);
	OBJECT_BASIC_ASSIGNMENT_OPERATOR_TEST(obj, std::list<long long>);
	OBJECT_BASIC_ASSIGNMENT_OPERATOR_TEST(obj, std::list<intmax_t>);
	OBJECT_BASIC_ASSIGNMENT_OPERATOR_TEST(obj, std::list<float>);
	OBJECT_BASIC_ASSIGNMENT_OPERATOR_TEST(obj, std::list<double>);
	OBJECT_BASIC_ASSIGNMENT_OPERATOR_TEST(obj, std::list<long double>);
	OBJECT_BASIC_ASSIGNMENT_OPERATOR_TEST(obj, std::list<std::u8string>);
	OBJECT_BASIC_ASSIGNMENT_OPERATOR_TEST(obj, std::list<object>);
}